

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_act.c
# Opt level: O3

bool aedit_level(CHAR_DATA *ch,char *argument)

{
  void *pvVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  char highc [4608];
  char lowc [4608];
  char local_2428 [4608];
  char local_1228 [4616];
  
  pvVar1 = ch->desc->pEdit;
  pcVar5 = one_argument(argument,local_1228);
  one_argument(pcVar5,local_2428);
  pcVar5 = "Syntax:  level [low] [high]\n\r";
  bVar2 = false;
  if ((local_1228[0] != '\0') && (bVar2 = false, local_2428[0] != '\0')) {
    bVar2 = is_number(local_1228);
    if (bVar2) {
      bVar2 = is_number(local_2428);
      if (bVar2) {
        iVar3 = atoi(local_1228);
        iVar4 = atoi(local_2428);
        if (iVar4 < 0x34 && 0 < iVar3) {
          *(short *)((long)pvVar1 + 0x54) = (short)iVar3;
          *(short *)((long)pvVar1 + 0x56) = (short)iVar4;
          bVar2 = true;
          pcVar5 = "Level range set.\n\r";
          goto LAB_0035b4c8;
        }
        pcVar5 = "Level range is from 1 to 51.\n\r";
      }
    }
    bVar2 = false;
  }
LAB_0035b4c8:
  send_to_char(pcVar5,ch);
  return bVar2;
}

Assistant:

bool aedit_level(CHAR_DATA *ch, char *argument)
{
	AREA_DATA *pArea;
	char lowc[MSL], highc[MSL];
	int low, high;

	EDIT_AREA(ch, pArea);

	argument = one_argument(argument, lowc);
	argument = one_argument(argument, highc);

	if (lowc[0] == '\0' || highc[0] == '\0' || !is_number(lowc) || !is_number(highc))
	{
		send_to_char("Syntax:  level [low] [high]\n\r", ch);
		return false;
	}

	low = atoi(lowc);
	high = atoi(highc);

	if (low < 1 || high > 51)
	{
		send_to_char("Level range is from 1 to 51.\n\r", ch);
		return false;
	}

	pArea->low_range = low;
	pArea->high_range = high;
	send_to_char("Level range set.\n\r", ch);
	return true;
}